

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O3

UChar * icu_63::UCharsTrie::findUniqueValueFromBranch
                  (UChar *pos,int32_t length,UBool haveUniqueValue,int32_t *uniqueValue)

{
  UChar UVar1;
  UBool UVar2;
  uint uVar3;
  UChar *pUVar4;
  long lVar5;
  UChar *pUVar6;
  int iVar7;
  
  pUVar6 = pos;
  if (5 < length) {
    do {
      pos = pUVar6 + 2;
      UVar1 = pUVar6[1];
      uVar3 = (uint)(ushort)UVar1;
      pUVar4 = pos;
      if (0xfbff < (ushort)UVar1) {
        if (UVar1 == L'\xffff') {
          uVar3 = CONCAT22(pUVar6[2],pUVar6[3]);
          pUVar4 = pUVar6 + 4;
        }
        else {
          uVar3 = (uint)(ushort)UVar1 * 0x10000 + (uint)(ushort)pUVar6[2] + 0x4000000;
          pUVar4 = pUVar6 + 3;
        }
      }
      pUVar4 = findUniqueValueFromBranch
                         (pUVar4 + (int)uVar3,(uint)length >> 1,haveUniqueValue,uniqueValue);
      if (pUVar4 == (UChar *)0x0) {
        return (UChar *)0x0;
      }
      if (0xfbff < (ushort)pUVar6[1]) {
        if (pUVar6[1] == L'\xffff') {
          pos = pUVar6 + 4;
        }
        else {
          pos = pUVar6 + 3;
        }
      }
      length = length - ((uint)length >> 1);
      pUVar6 = pos;
    } while (5 < length);
  }
  iVar7 = length + 1;
  do {
    pUVar6 = pos + 2;
    uVar3 = (ushort)pos[1] & 0x7fff;
    if (0x3fff < uVar3) {
      if (uVar3 == 0x7fff) {
        uVar3 = (uint)(ushort)pos[2] << 0x10;
        pUVar6 = pos + 3;
        lVar5 = 8;
      }
      else {
        uVar3 = uVar3 * 0x10000 + 0xc0000000;
        lVar5 = 6;
      }
      uVar3 = (ushort)*pUVar6 | uVar3;
      pUVar6 = (UChar *)((long)pos + lVar5);
    }
    if (pos[1] < L'\0') {
      if (haveUniqueValue == '\0') {
        *uniqueValue = uVar3;
        haveUniqueValue = '\x01';
      }
      else if (uVar3 != *uniqueValue) {
        return (UChar *)0x0;
      }
    }
    else {
      UVar2 = findUniqueValue(pUVar6 + (int)uVar3,haveUniqueValue,uniqueValue);
      haveUniqueValue = '\x01';
      if (UVar2 == '\0') {
        return (UChar *)0x0;
      }
    }
    iVar7 = iVar7 + -1;
    pos = pUVar6;
  } while (2 < iVar7);
  return pUVar6 + 1;
}

Assistant:

const UChar *
UCharsTrie::findUniqueValueFromBranch(const UChar *pos, int32_t length,
                                      UBool haveUniqueValue, int32_t &uniqueValue) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison unit
        if(NULL==findUniqueValueFromBranch(jumpByDelta(pos), length>>1, haveUniqueValue, uniqueValue)) {
            return NULL;
        }
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        ++pos;  // ignore a comparison unit
        // handle its value
        int32_t node=*pos++;
        UBool isFinal=(UBool)(node>>15);
        node&=0x7fff;
        int32_t value=readValue(pos, node);
        pos=skipValue(pos, node);
        if(isFinal) {
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return NULL;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
        } else {
            if(!findUniqueValue(pos+value, haveUniqueValue, uniqueValue)) {
                return NULL;
            }
            haveUniqueValue=TRUE;
        }
    } while(--length>1);
    return pos+1;  // ignore the last comparison unit
}